

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O1

Vec_Int_t * Abc_NtkFindDcLatches(Abc_Ntk_t *pNtk)

{
  int iVar1;
  void *pvVar2;
  Vec_Int_t *pVVar3;
  int *__s;
  long lVar4;
  int iVar5;
  Vec_Ptr_t *pVVar6;
  
  iVar1 = pNtk->nObjCounts[8];
  pVVar3 = (Vec_Int_t *)malloc(0x10);
  iVar5 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar5 = iVar1;
  }
  pVVar3->nSize = 0;
  pVVar3->nCap = iVar5;
  if (iVar5 == 0) {
    __s = (int *)0x0;
  }
  else {
    __s = (int *)malloc((long)iVar5 << 2);
  }
  pVVar3->pArray = __s;
  pVVar3->nSize = iVar1;
  memset(__s,0,(long)iVar1 * 4);
  pVVar6 = pNtk->vBoxes;
  if (0 < pVVar6->nSize) {
    lVar4 = 0;
    do {
      pvVar2 = pVVar6->pArray[lVar4];
      if (((*(uint *)((long)pvVar2 + 0x14) & 0xf) == 8) && (*(long *)((long)pvVar2 + 0x38) == 3)) {
        if (iVar1 <= lVar4) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        __s[lVar4] = 1;
        if ((*(uint *)((long)pvVar2 + 0x14) & 0xf) != 8) {
          __assert_fail("Abc_ObjIsLatch(pLatch)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abc.h"
                        ,0x1a3,"void Abc_LatchSetInit0(Abc_Obj_t *)");
        }
        *(undefined8 *)((long)pvVar2 + 0x38) = 1;
      }
      lVar4 = lVar4 + 1;
      pVVar6 = pNtk->vBoxes;
    } while (lVar4 < pVVar6->nSize);
  }
  return pVVar3;
}

Assistant:

Vec_Int_t * Abc_NtkFindDcLatches( Abc_Ntk_t * pNtk )
{
    Vec_Int_t * vUnknown;
    Abc_Obj_t * pObj;
    int i;
    vUnknown = Vec_IntStart( Abc_NtkLatchNum(pNtk) );
    Abc_NtkForEachLatch( pNtk, pObj, i )
        if ( Abc_LatchIsInitDc(pObj) )
        {
            Vec_IntWriteEntry( vUnknown, i, 1 );
            Abc_LatchSetInit0(pObj);
        }
    return vUnknown;
}